

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

void __thiscall Scene::create_descriptors(Scene *this,shared_ptr<myvk::Device> *device)

{
  pointer pTVar1;
  pointer pTVar2;
  size_type sVar3;
  uint uVar4;
  VkDescriptorType VVar5;
  size_type __n;
  ulong uVar6;
  initializer_list<VkDescriptorSetLayoutBinding> __l;
  initializer_list<VkDescriptorPoolSize> __l_00;
  allocator_type local_b9;
  vector<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_> image_infos;
  undefined1 local_98 [16];
  vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_> immutable_samplers;
  undefined1 local_40 [12];
  VkShaderStageFlags local_34;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  pTVar1 = (this->m_textures).super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pTVar2 = (this->m_textures).super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __n = (long)pTVar1 - (long)pTVar2 >> 5;
  sVar3 = 1;
  if (1 < (uint)__n) {
    sVar3 = __n;
  }
  if (pTVar1 == pTVar2) {
    local_98._0_8_ = &image_infos;
    image_infos.super__Vector_base<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x100000000;
    image_infos.super__Vector_base<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0x10;
    image_infos.super__Vector_base<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98._8_8_ = (element_type *)0x1;
    image_infos.super__Vector_base<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = (uint32_t)sVar3;
    myvk::DescriptorBindingFlagGroup::DescriptorBindingFlagGroup
              ((DescriptorBindingFlagGroup *)&immutable_samplers,
               (initializer_list<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_> *)local_98)
    ;
    myvk::DescriptorSetLayout::Create
              ((DescriptorSetLayout *)local_40,device,
               (DescriptorBindingFlagGroup *)&immutable_samplers);
    std::__shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_descriptor_set_layout).
                super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2> *)local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
    myvk::DescriptorBindingFlagGroup::~DescriptorBindingFlagGroup
              ((DescriptorBindingFlagGroup *)&immutable_samplers);
  }
  else {
    std::vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>::vector
              (&immutable_samplers,__n,(allocator_type *)&image_infos);
    for (uVar4 = 0;
        (ulong)uVar4 <
        (ulong)((long)(this->m_textures).
                      super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->m_textures).
                      super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>._M_impl.
                      super__Vector_impl_data._M_start >> 5); uVar4 = uVar4 + 1) {
      immutable_samplers.super__Vector_base<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] =
           ((this->m_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->m_sampler;
    }
    local_40._0_4_ = VK_DESCRIPTOR_TYPE_SAMPLER;
    local_40._4_4_ = 1;
    local_34 = 0x10;
    local_30._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         immutable_samplers.super__Vector_base<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    __l._M_len = 1;
    __l._M_array = (iterator)local_40;
    local_40._8_4_ = (uint32_t)sVar3;
    std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::vector
              ((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
                *)&image_infos,__l,&local_b9);
    myvk::DescriptorSetLayout::Create
              ((DescriptorSetLayout *)local_98,device,
               (vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
                *)&image_infos);
    std::__shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_descriptor_set_layout).
                super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2> *)local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
    std::_Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::
    ~_Vector_base((_Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
                   *)&image_infos);
    std::_Vector_base<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>::~_Vector_base
              (&immutable_samplers.super__Vector_base<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>
              );
  }
  VVar5 = (VkDescriptorType)
          ((ulong)((long)(this->m_textures).
                         super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                  (long)(this->m_textures).
                        super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 5);
  local_40._4_4_ = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
  if (VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER < VVar5) {
    local_40._4_4_ = VVar5;
  }
  local_40._0_4_ = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_40;
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            ((vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)
             &immutable_samplers,__l_00,(allocator_type *)local_98);
  myvk::DescriptorPool::Create
            ((DescriptorPool *)&image_infos,device,1,
             (vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)
             &immutable_samplers);
  std::__shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_descriptor_pool).
              super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2> *)&image_infos);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &image_infos.
              super__Vector_base<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::~_Vector_base
            ((_Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)
             &immutable_samplers);
  myvk::DescriptorSet::Create
            ((DescriptorSet *)&immutable_samplers,&this->m_descriptor_pool,
             &this->m_descriptor_set_layout);
  std::__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_descriptor_set).
              super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2> *)&immutable_samplers);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &immutable_samplers.super__Vector_base<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  pTVar1 = (this->m_textures).super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (this->m_textures).super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar1 != pTVar2) {
    std::vector<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_>::vector
              (&image_infos,(long)pTVar2 - (long)pTVar1 >> 5,(allocator_type *)&immutable_samplers);
    pTVar1 = (this->m_textures).super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (this->m_textures).super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (uVar4 = 0; uVar6 = (ulong)uVar4, uVar6 < (ulong)((long)pTVar2 - (long)pTVar1 >> 5);
        uVar4 = uVar4 + 1) {
      image_infos.super__Vector_base<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar6].imageLayout =
           VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
      image_infos.super__Vector_base<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar6].imageView =
           (pTVar1[uVar6].m_image_view.
            super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_image_view;
    }
    immutable_samplers.super__Vector_base<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    immutable_samplers.super__Vector_base<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x23;
    immutable_samplers.super__Vector_base<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((this->m_descriptor_set).
                   super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  m_descriptor_set;
    (*vkUpdateDescriptorSets)
              (((device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               m_device,1,(VkWriteDescriptorSet *)&immutable_samplers,0,(VkCopyDescriptorSet *)0x0);
    std::_Vector_base<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_>::~_Vector_base
              (&image_infos.
                super__Vector_base<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_>);
  }
  return;
}

Assistant:

void Scene::create_descriptors(const std::shared_ptr<myvk::Device> &device) {
	{
		VkDescriptorSetLayoutBinding layout_binding = {};
		layout_binding.binding = 0;
		layout_binding.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
		layout_binding.descriptorCount = std::max((uint32_t)m_textures.size(), 1u);
		layout_binding.stageFlags = VK_SHADER_STAGE_FRAGMENT_BIT;

		if (!m_textures.empty()) {
			std::vector<VkSampler> immutable_samplers(m_textures.size());
			for (uint32_t i = 0; i < m_textures.size(); ++i)
				immutable_samplers[i] = m_sampler->GetHandle();
			layout_binding.pImmutableSamplers = immutable_samplers.data();
			m_descriptor_set_layout = myvk::DescriptorSetLayout::Create(device, {layout_binding});
		} else {
			m_descriptor_set_layout = myvk::DescriptorSetLayout::Create(
			    device, {{layout_binding, VK_DESCRIPTOR_BINDING_PARTIALLY_BOUND_BIT}});
		}
	}
	m_descriptor_pool = myvk::DescriptorPool::Create(
	    device, 1, {{VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, std::max((uint32_t)m_textures.size(), 1u)}});
	m_descriptor_set = myvk::DescriptorSet::Create(m_descriptor_pool, m_descriptor_set_layout);

	if (!m_textures.empty()) {
		std::vector<VkDescriptorImageInfo> image_infos(m_textures.size());
		for (uint32_t i = 0; i < m_textures.size(); ++i) {
			image_infos[i].imageLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
			image_infos[i].imageView = m_textures[i].m_image_view->GetHandle();
			// image_infos[i].sampler = m_sampler->GetHandle(); // No need for immutable samplers
		}

		VkWriteDescriptorSet write = {};
		write.sType = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
		write.dstSet = m_descriptor_set->GetHandle();
		write.dstBinding = 0;
		write.dstArrayElement = 0;
		write.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
		write.descriptorCount = image_infos.size();
		write.pImageInfo = image_infos.data();

		vkUpdateDescriptorSets(device->GetHandle(), 1, &write, 0, nullptr);
	}
}